

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O3

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  undefined1 (*pauVar6) [16];
  int iVar7;
  uint uVar8;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar5 = 0;
    do {
      pauVar6 = (undefined1 (*) [16])
                (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar4 < 4) {
        uVar8 = 0;
      }
      else {
        fVar1 = (this->super_Clip).min;
        fVar10 = (this->super_Clip).max;
        iVar7 = 3;
        do {
          auVar11._4_4_ = fVar1;
          auVar11._0_4_ = fVar1;
          auVar11._8_4_ = fVar1;
          auVar11._12_4_ = fVar1;
          auVar11 = maxps(*pauVar6,auVar11);
          auVar3._4_4_ = fVar10;
          auVar3._0_4_ = fVar10;
          auVar3._8_4_ = fVar10;
          auVar3._12_4_ = fVar10;
          auVar11 = minps(auVar11,auVar3);
          *pauVar6 = auVar11;
          pauVar6 = pauVar6 + 1;
          iVar7 = iVar7 + 4;
          uVar8 = uVar4 & 0xfffffffc;
        } while (iVar7 < (int)uVar4);
      }
      if (uVar4 - uVar8 != 0 && (int)uVar8 <= (int)uVar4) {
        lVar9 = 0;
        do {
          fVar1 = (this->super_Clip).min;
          fVar10 = *(float *)(*pauVar6 + lVar9 * 4);
          if (*(float *)(*pauVar6 + lVar9 * 4) < fVar1) {
            *(float *)(*pauVar6 + lVar9 * 4) = fVar1;
            fVar10 = fVar1;
          }
          fVar1 = (this->super_Clip).max;
          if (fVar1 < fVar10) {
            *(float *)(*pauVar6 + lVar9 * 4) = fVar1;
          }
          lVar9 = lVar9 + 1;
        } while (uVar4 - uVar8 != (int)lVar9);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar2);
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}